

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

int katherine_set_sensor_register(katherine_device_t *device,char reg_idx,int32_t reg_value)

{
  int iVar1;
  int5 local_30;
  undefined3 uStack_2b;
  
  iVar1 = katherine_udp_mutex_lock(&device->control_socket);
  if (iVar1 == 0) {
    _local_30 = CONCAT35(0x800,(uint5)(byte)reg_idx << 0x20);
    katherine_cmd_long((char *)&local_30,(long)reg_value);
    iVar1 = katherine_udp_send_exact(&device->control_socket,&local_30,8);
    if (iVar1 == 0) {
      iVar1 = katherine_cmd_wait_ack(&device->control_socket);
    }
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  return iVar1;
}

Assistant:

int
katherine_set_sensor_register(katherine_device_t *device, char reg_idx, int32_t reg_value)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    char cmd[8] = {0};
    cmd[6] = CMD_TYPE_SENSOR_REGISTER_SETTING;
    cmd[4] = reg_idx;
    katherine_cmd_long(cmd, reg_value);

    res = katherine_cmd(&device->control_socket, &cmd, sizeof(cmd));
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}